

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::operator*(mat3 *__return_storage_ptr__,float_t s,mat3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = m->m[0].x;
  fVar2 = m->m[0].y;
  fVar3 = m->m[0].z;
  fVar4 = m->m[1].x;
  fVar5 = m->m[1].y;
  fVar6 = m->m[1].z;
  fVar7 = m->m[2].x;
  fVar8 = m->m[2].y;
  fVar9 = m->m[2].z;
  __return_storage_ptr__->m[0].x = 0.0;
  __return_storage_ptr__->m[0].y = 0.0;
  *(undefined8 *)&__return_storage_ptr__->m[0].z = 0;
  __return_storage_ptr__->m[1].y = 0.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[0].x = fVar1 * s;
  __return_storage_ptr__->m[0].y = fVar2 * s;
  __return_storage_ptr__->m[0].z = fVar3 * s;
  __return_storage_ptr__->m[1].x = fVar4 * s;
  __return_storage_ptr__->m[1].y = fVar5 * s;
  __return_storage_ptr__->m[1].z = fVar6 * s;
  __return_storage_ptr__->m[2].x = fVar7 * s;
  __return_storage_ptr__->m[2].y = fVar8 * s;
  __return_storage_ptr__->m[2].z = s * fVar9;
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const float_t s, const mat3& m)
{
    return mat3(s * m[0], s * m[1], s * m[2]);
}